

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_by_class(Omega_h *this,Mesh *mesh,Int ent_dim,Int class_dim,I32 class_id)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Bytes local_b0;
  Read<signed_char> local_a0;
  Read<int> local_90;
  undefined1 local_80 [8];
  Bytes id_marks;
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  Read<int> e2class_id;
  I32 class_id_local;
  Int class_dim_local;
  Int ent_dim_local;
  Mesh *mesh_local;
  
  e2class_id.write_.shared_alloc_.direct_ptr._4_4_ = class_id;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"class_id",&local_59);
  Mesh::get_array<int>((Mesh *)local_38,(Int)mesh,(string *)(ulong)(uint)ent_dim);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  Read<int>::Read(&local_90,(Read<int> *)local_38);
  each_eq_to<int>((Omega_h *)local_80,&local_90,e2class_id.write_.shared_alloc_.direct_ptr._4_4_);
  Read<int>::~Read(&local_90);
  Read<signed_char>::Read(&local_a0,(Read<signed_char> *)local_80);
  mark_by_class_dim((Omega_h *)&local_b0,mesh,ent_dim,class_dim);
  land_each(this,&local_a0,&local_b0);
  Read<signed_char>::~Read(&local_b0);
  Read<signed_char>::~Read(&local_a0);
  Read<signed_char>::~Read((Read<signed_char> *)local_80);
  Read<int>::~Read((Read<int> *)local_38);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_by_class(Mesh* mesh, Int ent_dim, Int class_dim, I32 class_id) {
  auto e2class_id = mesh->get_array<ClassId>(ent_dim, "class_id");
  auto id_marks = each_eq_to(e2class_id, class_id);
  return land_each(id_marks, mark_by_class_dim(mesh, ent_dim, class_dim));
}